

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O0

RenderDeviceGLImpl * __thiscall
Diligent::DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
::GetDevice(DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
            *this)

{
  Char *Message;
  char (*in_RCX) [10];
  undefined1 local_30 [8];
  string msg;
  DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
  *this_local;
  
  if (this->m_pDevice == (RenderDeviceGLImpl *)0x0) {
    msg.field_2._8_8_ = this;
    FormatString<char[26],char[10]>
              ((string *)local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pDevice",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetDevice",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
               ,0xbc);
    std::__cxx11::string::~string((string *)local_30);
  }
  return this->m_pDevice;
}

Assistant:

RenderDeviceImplType* GetDevice() const
    {
        VERIFY_EXPR(m_pDevice);
        return m_pDevice;
    }